

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPSocket.cpp
# Opt level: O1

bool __thiscall net_uv::UDPSocket::udpSend(UDPSocket *this,char *data,int32_t len,sockaddr *addr)

{
  uv_udp_t *handle;
  int err;
  uv_buf_t *bufs;
  char *pcVar1;
  uv_udp_send_t *req;
  size_t __size;
  bool bVar2;
  
  handle = this->m_udp;
  if (handle == (uv_udp_t *)0x0) {
    bVar2 = false;
  }
  else {
    bufs = (uv_buf_t *)malloc(0x10);
    __size = (size_t)len;
    pcVar1 = (char *)malloc(__size);
    bufs->base = pcVar1;
    bufs->len = __size;
    memcpy(pcVar1,data,__size);
    req = (uv_udp_send_t *)malloc(0x140);
    req->data = bufs;
    err = uv_udp_send(req,handle,bufs,1,addr,uv_on_udp_send);
    bVar2 = err == 0;
    if (!bVar2) {
      pcVar1 = uv_strerror(err);
      bVar2 = false;
      net_uvLog(3,"udp send error %s",pcVar1);
    }
  }
  return bVar2;
}

Assistant:

bool UDPSocket::udpSend(const char* data, int32_t len, const struct sockaddr* addr)
{
	if (m_udp == NULL)
	{
		return false;
	}
	uv_buf_t* buf = (uv_buf_t*)fc_malloc(sizeof(uv_buf_t));
	buf->base = (char*)fc_malloc(len);
	buf->len = len;

	memcpy(buf->base, data, len);

	uv_udp_send_t* udp_send = (uv_udp_send_t*)fc_malloc(sizeof(uv_udp_send_t));
	udp_send->data = buf;
	int32_t r = uv_udp_send(udp_send, m_udp, buf, 1, addr, uv_on_udp_send);

	if (r != 0)
	{
		NET_UV_LOG(NET_UV_L_ERROR, "udp send error %s", uv_strerror(r));
		return false;
	}
	return true;
}